

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cpp
# Opt level: O1

Image * operator^(Image *__return_storage_ptr__,Image *image1,Image *image2)

{
  int iVar1;
  Image *pIVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  Image *image;
  int in_ECX;
  int iVar7;
  void *__child_stack;
  void *in_R8;
  int j;
  long lVar8;
  int i;
  int i_00;
  Image img1;
  Image result;
  Image img2;
  Image local_80;
  Image *local_68;
  Image local_60;
  Image local_48;
  
  Image::binarize(&local_80,image1);
  Image::binarize(&local_48,image2);
  local_68 = __return_storage_ptr__;
  Image::clone(&local_60,(__fn *)&local_80,__child_stack,in_ECX,in_R8);
  i_00 = 0;
  while( true ) {
    iVar3 = Image::getRow(&local_80);
    if (iVar3 <= i_00) break;
    lVar8 = 0;
    while( true ) {
      iVar3 = Image::getCol(&local_80);
      if (iVar3 <= lVar8) break;
      piVar6 = Image::operator[](&local_80,i_00);
      iVar3 = piVar6[lVar8];
      iVar4 = Image::getMaxGray(&local_80);
      piVar6 = Image::operator[](&local_48,i_00);
      iVar1 = piVar6[lVar8];
      iVar5 = Image::getMaxGray(&local_48);
      piVar6 = Image::operator[](&local_60,i_00);
      iVar7 = 0;
      if ((iVar1 == iVar5) != (iVar3 == iVar4)) {
        iVar7 = 0xff;
      }
      piVar6[lVar8] = iVar7;
      lVar8 = lVar8 + 1;
    }
    i_00 = i_00 + 1;
  }
  image = Image::normalize(&local_60);
  pIVar2 = local_68;
  Image::Image(local_68,image);
  Image::~Image(&local_60);
  Image::~Image(&local_48);
  Image::~Image(&local_80);
  return pIVar2;
}

Assistant:

Image operator^(Image &image1, Image &image2)
{
    Image img1 = image1.binarize(), img2 = image2.binarize();

    Image result = img1.clone();

    for (int i = 0; i < img1.getRow(); ++i) {
        for (int j = 0; j < img1.getCol(); ++j) {
            result[i][j] =  img1[i][j] == img1.getMaxGray() ^ img2[i][j] == img2.getMaxGray() ? 255 : 0;
        }
    }

    return result.normalize();
}